

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warp_plane_sse4.c
# Opt level: O0

void filter_src_pixels_vertical(__m128i *tmp,__m128i *coeffs,__m128i *res_lo,__m128i *res_hi,int k)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int *in_RCX;
  int *in_RDX;
  undefined1 (*in_RSI) [16];
  long in_RDI;
  int in_R8D;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  __m128i src_1;
  __m128i res_even;
  __m128i res_6;
  __m128i res_4;
  __m128i res_2;
  __m128i res_0;
  __m128i src_6;
  __m128i src_4;
  __m128i src_2;
  __m128i src_0;
  __m128i *src;
  int iStack_2f4;
  int iStack_2f0;
  int iStack_2ec;
  int local_2e8;
  int iStack_2e4;
  int iStack_2e0;
  int iStack_2dc;
  int local_2d8;
  int iStack_2d4;
  int iStack_2d0;
  int iStack_2cc;
  int local_2c8;
  int iStack_2c4;
  int iStack_2c0;
  int iStack_2bc;
  int local_2b8;
  int iStack_2b4;
  int iStack_2b0;
  int iStack_2ac;
  int iStack_294;
  int iStack_290;
  int iStack_28c;
  int local_288;
  int iStack_284;
  int iStack_280;
  int iStack_27c;
  int local_278;
  int iStack_274;
  int iStack_270;
  int iStack_26c;
  int local_268;
  int iStack_264;
  int iStack_260;
  int iStack_25c;
  int local_258;
  int iStack_254;
  int iStack_250;
  int iStack_24c;
  undefined2 local_248;
  undefined2 uStack_246;
  undefined2 uStack_244;
  undefined2 uStack_242;
  undefined2 local_238;
  undefined2 uStack_236;
  undefined2 uStack_234;
  undefined2 uStack_232;
  undefined2 local_228;
  undefined2 uStack_226;
  undefined2 uStack_224;
  undefined2 uStack_222;
  undefined2 local_218;
  undefined2 uStack_216;
  undefined2 uStack_214;
  undefined2 uStack_212;
  undefined2 local_208;
  undefined2 uStack_206;
  undefined2 uStack_204;
  undefined2 uStack_202;
  undefined2 local_1f8;
  undefined2 uStack_1f6;
  undefined2 uStack_1f4;
  undefined2 uStack_1f2;
  undefined2 local_1e8;
  undefined2 uStack_1e6;
  undefined2 uStack_1e4;
  undefined2 uStack_1e2;
  undefined2 local_1d8;
  undefined2 uStack_1d6;
  undefined2 uStack_1d4;
  undefined2 uStack_1d2;
  __m128i res_odd;
  __m128i res_7;
  __m128i res_5;
  __m128i res_3;
  __m128i res_1;
  __m128i src_7;
  __m128i src_5;
  __m128i src_3;
  
  puVar1 = (undefined8 *)((long)in_R8D * 0x10 + 0x40 + in_RDI);
  uVar2 = *puVar1;
  uVar5 = puVar1[2];
  local_1d8 = (undefined2)uVar2;
  uStack_1d6 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_1d4 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_1d2 = (undefined2)((ulong)uVar2 >> 0x30);
  local_1e8 = (undefined2)uVar5;
  uStack_1e6 = (undefined2)((ulong)uVar5 >> 0x10);
  uStack_1e4 = (undefined2)((ulong)uVar5 >> 0x20);
  uStack_1e2 = (undefined2)((ulong)uVar5 >> 0x30);
  uVar2 = puVar1[4];
  uVar5 = puVar1[6];
  local_1f8 = (undefined2)uVar2;
  uStack_1f6 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_1f4 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_1f2 = (undefined2)((ulong)uVar2 >> 0x30);
  local_208 = (undefined2)uVar5;
  uStack_206 = (undefined2)((ulong)uVar5 >> 0x10);
  uStack_204 = (undefined2)((ulong)uVar5 >> 0x20);
  uStack_202 = (undefined2)((ulong)uVar5 >> 0x30);
  uVar2 = puVar1[8];
  uVar5 = puVar1[10];
  local_218 = (undefined2)uVar2;
  uStack_216 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_214 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_212 = (undefined2)((ulong)uVar2 >> 0x30);
  local_228 = (undefined2)uVar5;
  uStack_226 = (undefined2)((ulong)uVar5 >> 0x10);
  uStack_224 = (undefined2)((ulong)uVar5 >> 0x20);
  uStack_222 = (undefined2)((ulong)uVar5 >> 0x30);
  uVar2 = puVar1[0xc];
  uVar5 = puVar1[0xe];
  local_238 = (undefined2)uVar2;
  uStack_236 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_234 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_232 = (undefined2)((ulong)uVar2 >> 0x30);
  local_248 = (undefined2)uVar5;
  uStack_246 = (undefined2)((ulong)uVar5 >> 0x10);
  uStack_244 = (undefined2)((ulong)uVar5 >> 0x20);
  uStack_242 = (undefined2)((ulong)uVar5 >> 0x30);
  auVar11._2_2_ = local_1e8;
  auVar11._0_2_ = local_1d8;
  auVar11._4_2_ = uStack_1d6;
  auVar11._6_2_ = uStack_1e6;
  auVar11._10_2_ = uStack_1e4;
  auVar11._8_2_ = uStack_1d4;
  auVar11._12_2_ = uStack_1d2;
  auVar11._14_2_ = uStack_1e2;
  auVar12 = pmaddwd(auVar11,*in_RSI);
  auVar10._2_2_ = local_208;
  auVar10._0_2_ = local_1f8;
  auVar10._4_2_ = uStack_1f6;
  auVar10._6_2_ = uStack_206;
  auVar10._10_2_ = uStack_204;
  auVar10._8_2_ = uStack_1f4;
  auVar10._12_2_ = uStack_1f2;
  auVar10._14_2_ = uStack_202;
  auVar13 = pmaddwd(auVar10,in_RSI[1]);
  auVar9._2_2_ = local_228;
  auVar9._0_2_ = local_218;
  auVar9._4_2_ = uStack_216;
  auVar9._6_2_ = uStack_226;
  auVar9._10_2_ = uStack_224;
  auVar9._8_2_ = uStack_214;
  auVar9._12_2_ = uStack_212;
  auVar9._14_2_ = uStack_222;
  auVar14 = pmaddwd(auVar9,in_RSI[2]);
  auVar8._2_2_ = local_248;
  auVar8._0_2_ = local_238;
  auVar8._4_2_ = uStack_236;
  auVar8._6_2_ = uStack_246;
  auVar8._10_2_ = uStack_244;
  auVar8._8_2_ = uStack_234;
  auVar8._12_2_ = uStack_232;
  auVar8._14_2_ = uStack_242;
  auVar15 = pmaddwd(auVar8,in_RSI[3]);
  local_258 = auVar12._0_4_;
  iStack_254 = auVar12._4_4_;
  iStack_250 = auVar12._8_4_;
  iStack_24c = auVar12._12_4_;
  local_268 = auVar13._0_4_;
  iStack_264 = auVar13._4_4_;
  iStack_260 = auVar13._8_4_;
  iStack_25c = auVar13._12_4_;
  local_278 = auVar14._0_4_;
  iStack_274 = auVar14._4_4_;
  iStack_270 = auVar14._8_4_;
  iStack_26c = auVar14._12_4_;
  local_288 = auVar15._0_4_;
  iStack_284 = auVar15._4_4_;
  iStack_280 = auVar15._8_4_;
  iStack_27c = auVar15._12_4_;
  uVar2 = CONCAT26((short)((uint)(iStack_254 + iStack_264) >> 0x10),
                   CONCAT24((short)(iStack_254 + iStack_264),local_258 + local_268));
  auVar3._8_2_ = (short)(iStack_250 + iStack_260);
  auVar3._0_8_ = uVar2;
  auVar3._10_2_ = (short)((uint)(iStack_250 + iStack_260) >> 0x10);
  auVar12._12_2_ = (short)(iStack_24c + iStack_25c);
  auVar12._0_12_ = auVar3;
  auVar12._14_2_ = (short)((uint)(iStack_24c + iStack_25c) >> 0x10);
  iStack_294 = (int)((ulong)uVar2 >> 0x20);
  iStack_290 = auVar3._8_4_;
  iStack_28c = auVar12._12_4_;
  uVar2 = puVar1[1];
  uVar5 = puVar1[3];
  src_3[0]._0_2_ = (undefined2)uVar2;
  src_3[0]._2_2_ = (undefined2)((ulong)uVar2 >> 0x10);
  src_3[0]._4_2_ = (undefined2)((ulong)uVar2 >> 0x20);
  src_3[0]._6_2_ = (undefined2)((ulong)uVar2 >> 0x30);
  src_5[0]._0_2_ = (undefined2)uVar5;
  src_5[0]._2_2_ = (undefined2)((ulong)uVar5 >> 0x10);
  src_5[0]._4_2_ = (undefined2)((ulong)uVar5 >> 0x20);
  src_5[0]._6_2_ = (undefined2)((ulong)uVar5 >> 0x30);
  uVar2 = puVar1[5];
  uVar5 = puVar1[7];
  src_7[0]._0_2_ = (undefined2)uVar2;
  src_7[0]._2_2_ = (undefined2)((ulong)uVar2 >> 0x10);
  src_7[0]._4_2_ = (undefined2)((ulong)uVar2 >> 0x20);
  src_7[0]._6_2_ = (undefined2)((ulong)uVar2 >> 0x30);
  res_1[0]._0_2_ = (undefined2)uVar5;
  res_1[0]._2_2_ = (undefined2)((ulong)uVar5 >> 0x10);
  res_1[0]._4_2_ = (undefined2)((ulong)uVar5 >> 0x20);
  res_1[0]._6_2_ = (undefined2)((ulong)uVar5 >> 0x30);
  uVar2 = puVar1[9];
  uVar5 = puVar1[0xb];
  res_3[0]._0_2_ = (undefined2)uVar2;
  res_3[0]._2_2_ = (undefined2)((ulong)uVar2 >> 0x10);
  res_3[0]._4_2_ = (undefined2)((ulong)uVar2 >> 0x20);
  res_3[0]._6_2_ = (undefined2)((ulong)uVar2 >> 0x30);
  res_5[0]._0_2_ = (undefined2)uVar5;
  res_5[0]._2_2_ = (undefined2)((ulong)uVar5 >> 0x10);
  res_5[0]._4_2_ = (undefined2)((ulong)uVar5 >> 0x20);
  res_5[0]._6_2_ = (undefined2)((ulong)uVar5 >> 0x30);
  uVar2 = puVar1[0xd];
  uVar5 = puVar1[0xf];
  res_7[0]._0_2_ = (undefined2)uVar2;
  res_7[0]._2_2_ = (undefined2)((ulong)uVar2 >> 0x10);
  res_7[0]._4_2_ = (undefined2)((ulong)uVar2 >> 0x20);
  res_7[0]._6_2_ = (undefined2)((ulong)uVar2 >> 0x30);
  res_odd[0]._0_2_ = (undefined2)uVar5;
  res_odd[0]._2_2_ = (undefined2)((ulong)uVar5 >> 0x10);
  res_odd[0]._4_2_ = (undefined2)((ulong)uVar5 >> 0x20);
  res_odd[0]._6_2_ = (undefined2)((ulong)uVar5 >> 0x30);
  auVar7._2_2_ = (undefined2)src_5[0];
  auVar7._0_2_ = (undefined2)src_3[0];
  auVar7._4_2_ = src_3[0]._2_2_;
  auVar7._6_2_ = src_5[0]._2_2_;
  auVar7._10_2_ = src_5[0]._4_2_;
  auVar7._8_2_ = src_3[0]._4_2_;
  auVar7._12_2_ = src_3[0]._6_2_;
  auVar7._14_2_ = src_5[0]._6_2_;
  auVar12 = pmaddwd(auVar7,in_RSI[4]);
  auVar6._2_2_ = (undefined2)res_1[0];
  auVar6._0_2_ = (undefined2)src_7[0];
  auVar6._4_2_ = src_7[0]._2_2_;
  auVar6._6_2_ = res_1[0]._2_2_;
  auVar6._10_2_ = res_1[0]._4_2_;
  auVar6._8_2_ = src_7[0]._4_2_;
  auVar6._12_2_ = src_7[0]._6_2_;
  auVar6._14_2_ = res_1[0]._6_2_;
  auVar13 = pmaddwd(auVar6,in_RSI[5]);
  auVar15._2_2_ = (undefined2)res_5[0];
  auVar15._0_2_ = (undefined2)res_3[0];
  auVar15._4_2_ = res_3[0]._2_2_;
  auVar15._6_2_ = res_5[0]._2_2_;
  auVar15._10_2_ = res_5[0]._4_2_;
  auVar15._8_2_ = res_3[0]._4_2_;
  auVar15._12_2_ = res_3[0]._6_2_;
  auVar15._14_2_ = res_5[0]._6_2_;
  auVar15 = pmaddwd(auVar15,in_RSI[6]);
  auVar14._2_2_ = (undefined2)res_odd[0];
  auVar14._0_2_ = (undefined2)res_7[0];
  auVar14._4_2_ = res_7[0]._2_2_;
  auVar14._6_2_ = res_odd[0]._2_2_;
  auVar14._10_2_ = res_odd[0]._4_2_;
  auVar14._8_2_ = res_7[0]._4_2_;
  auVar14._12_2_ = res_7[0]._6_2_;
  auVar14._14_2_ = res_odd[0]._6_2_;
  auVar14 = pmaddwd(auVar14,in_RSI[7]);
  local_2b8 = auVar12._0_4_;
  iStack_2b4 = auVar12._4_4_;
  iStack_2b0 = auVar12._8_4_;
  iStack_2ac = auVar12._12_4_;
  local_2c8 = auVar13._0_4_;
  iStack_2c4 = auVar13._4_4_;
  iStack_2c0 = auVar13._8_4_;
  iStack_2bc = auVar13._12_4_;
  local_2d8 = auVar15._0_4_;
  iStack_2d4 = auVar15._4_4_;
  iStack_2d0 = auVar15._8_4_;
  iStack_2cc = auVar15._12_4_;
  local_2e8 = auVar14._0_4_;
  iStack_2e4 = auVar14._4_4_;
  iStack_2e0 = auVar14._8_4_;
  iStack_2dc = auVar14._12_4_;
  uVar2 = CONCAT26((short)((uint)(iStack_2b4 + iStack_2c4) >> 0x10),
                   CONCAT24((short)(iStack_2b4 + iStack_2c4),local_2b8 + local_2c8));
  auVar4._8_2_ = (short)(iStack_2b0 + iStack_2c0);
  auVar4._0_8_ = uVar2;
  auVar4._10_2_ = (short)((uint)(iStack_2b0 + iStack_2c0) >> 0x10);
  auVar13._12_2_ = (short)(iStack_2ac + iStack_2bc);
  auVar13._0_12_ = auVar4;
  auVar13._14_2_ = (short)((uint)(iStack_2ac + iStack_2bc) >> 0x10);
  iStack_2f4 = (int)((ulong)uVar2 >> 0x20);
  iStack_2f0 = auVar4._8_4_;
  iStack_2ec = auVar13._12_4_;
  *in_RDX = local_258 + local_268 + local_278 + local_288;
  in_RDX[1] = local_2b8 + local_2c8 + local_2d8 + local_2e8;
  in_RDX[2] = iStack_294 + iStack_274 + iStack_284;
  in_RDX[3] = iStack_2f4 + iStack_2d4 + iStack_2e4;
  *in_RCX = iStack_290 + iStack_270 + iStack_280;
  in_RCX[1] = iStack_2f0 + iStack_2d0 + iStack_2e0;
  in_RCX[2] = iStack_28c + iStack_26c + iStack_27c;
  in_RCX[3] = iStack_2ec + iStack_2cc + iStack_2dc;
  return;
}

Assistant:

static inline void filter_src_pixels_vertical(__m128i *tmp, __m128i *coeffs,
                                              __m128i *res_lo, __m128i *res_hi,
                                              int k) {
  // Load from tmp and rearrange pairs of consecutive rows into the
  // column order 0 0 2 2 4 4 6 6; 1 1 3 3 5 5 7 7
  const __m128i *src = tmp + (k + 4);
  const __m128i src_0 = _mm_unpacklo_epi16(src[0], src[1]);
  const __m128i src_2 = _mm_unpacklo_epi16(src[2], src[3]);
  const __m128i src_4 = _mm_unpacklo_epi16(src[4], src[5]);
  const __m128i src_6 = _mm_unpacklo_epi16(src[6], src[7]);

  const __m128i res_0 = _mm_madd_epi16(src_0, coeffs[0]);
  const __m128i res_2 = _mm_madd_epi16(src_2, coeffs[1]);
  const __m128i res_4 = _mm_madd_epi16(src_4, coeffs[2]);
  const __m128i res_6 = _mm_madd_epi16(src_6, coeffs[3]);

  const __m128i res_even =
      _mm_add_epi32(_mm_add_epi32(res_0, res_2), _mm_add_epi32(res_4, res_6));

  // Filter odd-index pixels
  const __m128i src_1 = _mm_unpackhi_epi16(src[0], src[1]);
  const __m128i src_3 = _mm_unpackhi_epi16(src[2], src[3]);
  const __m128i src_5 = _mm_unpackhi_epi16(src[4], src[5]);
  const __m128i src_7 = _mm_unpackhi_epi16(src[6], src[7]);

  const __m128i res_1 = _mm_madd_epi16(src_1, coeffs[4]);
  const __m128i res_3 = _mm_madd_epi16(src_3, coeffs[5]);
  const __m128i res_5 = _mm_madd_epi16(src_5, coeffs[6]);
  const __m128i res_7 = _mm_madd_epi16(src_7, coeffs[7]);

  const __m128i res_odd =
      _mm_add_epi32(_mm_add_epi32(res_1, res_3), _mm_add_epi32(res_5, res_7));

  // Rearrange pixels back into the order 0 ... 7
  *res_lo = _mm_unpacklo_epi32(res_even, res_odd);
  *res_hi = _mm_unpackhi_epi32(res_even, res_odd);
}